

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O0

bool __thiscall
cppcms::impl::mem_cache<cppcms::impl::thread_settings>::del_ref
          (mem_cache<cppcms::impl::thread_settings> *this)

{
  int iVar1;
  unique_lock<booster::shared_mutex> *in_RDI;
  wrlock_guard lock;
  mutex_type *in_stack_ffffffffffffffc8;
  
  std::unique_ptr<booster::shared_mutex,_std::default_delete<booster::shared_mutex>_>::operator*
            ((unique_ptr<booster::shared_mutex,_std::default_delete<booster::shared_mutex>_> *)
             in_RDI);
  std::unique_lock<booster::shared_mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffc8);
  *(int *)&in_RDI[0xd]._M_owns = *(int *)&in_RDI[0xd]._M_owns + -1;
  iVar1 = *(int *)&in_RDI[0xd]._M_owns;
  std::unique_lock<booster::shared_mutex>::~unique_lock(in_RDI);
  return iVar1 == 0;
}

Assistant:

virtual bool del_ref()
	{
		// This object should not be deleted because it is created only once
		// and exists in memory
		if(Setup::process_shared)
			return false;
		wrlock_guard lock(*access_lock);
		refs--;
		if(refs==0)
			return true;
		return false;
	}